

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

double cross_entropy<unsigned_long,unsigned_int>
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *P,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *Q)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  pointer puVar4;
  pointer puVar5;
  int iVar6;
  int iVar7;
  pointer puVar8;
  pointer puVar9;
  size_t i;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 in_XMM2 [16];
  undefined1 extraout_var [56];
  
  puVar5 = (P->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar6 = 0;
  puVar4 = (P->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar8 = puVar4; puVar8 != puVar5; puVar8 = puVar8 + 1) {
    iVar6 = iVar6 + (int)*puVar8;
  }
  iVar7 = 0;
  for (puVar9 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 != (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
    iVar7 = iVar7 + *puVar9;
  }
  auVar12 = ZEXT1664(ZEXT816(0));
  for (uVar10 = 0; uVar10 < (ulong)((long)puVar5 - (long)puVar4 >> 3); uVar10 = uVar10 + 1) {
    if ((puVar4[uVar10] != 0) &&
       (uVar2 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar10], uVar2 != 0)) {
      auVar3 = vcvtusi2sd_avx512f(in_XMM2,puVar4[uVar10]);
      auVar11 = vcvtusi2sd_avx512f(in_XMM2,uVar2);
      auVar13._0_8_ = log2(auVar11._0_8_ / (double)iVar7);
      auVar13._8_56_ = extraout_var;
      puVar4 = (P->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (P->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = auVar3._0_8_ / (double)iVar6;
      auVar11 = vfmadd231sd_fma(auVar12._0_16_,auVar13._0_16_,auVar1);
      auVar12 = ZEXT1664(auVar11);
    }
  }
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar12._0_16_,auVar11);
  return auVar11._0_8_;
}

Assistant:

double cross_entropy(const std::vector<X>& P, const std::vector<Y>& Q)
{
    double H0 = 0.0;
    double n = std::accumulate(std::begin(P), std::end(P), 0);
    double m = std::accumulate(std::begin(Q), std::end(Q), 0);
    for (size_t i = 0; i < P.size(); i++) {
        if (P[i] != 0 && Q[i] != 0) {
            double p = double(P[i]) / n;
            double q = double(Q[i]) / m;
            H0 += (p * log2(q));
        }
    }
    return -H0;
}